

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderUtil.cpp
# Opt level: O0

int glu::getDataTypeNumLocations(DataType dataType)

{
  bool bVar1;
  undefined4 local_c;
  DataType dataType_local;
  
  bVar1 = isDataTypeScalarOrVector(dataType);
  if (bVar1) {
    local_c = 1;
  }
  else {
    bVar1 = isDataTypeMatrix(dataType);
    if (bVar1) {
      local_c = getDataTypeMatrixNumColumns(dataType);
    }
    else {
      local_c = 0;
    }
  }
  return local_c;
}

Assistant:

int	getDataTypeNumLocations	(DataType dataType)
{
	if (isDataTypeScalarOrVector(dataType))
		return 1;
	else if (isDataTypeMatrix(dataType))
		return getDataTypeMatrixNumColumns(dataType);

	DE_FATAL("Illegal datatype.");
	return 0;
}